

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void mxx::
     global_scan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
               (int *begin,int *end,int *out,undefined1 param_4,comm *param_5)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  T sum;
  comm nonzero_comm;
  undefined4 local_4c;
  comm local_48;
  
  comm::split(&local_48,param_5,(uint)((long)end - (long)begin != 0));
  if ((long)end - (long)begin != 0) {
    iVar1 = *begin;
    *out = iVar1;
    piVar4 = begin + 1;
    if (piVar4 != end) {
      piVar5 = out + 1;
      do {
        if (*piVar4 < iVar1) {
          iVar1 = *piVar4;
        }
        *piVar5 = iVar1;
        piVar4 = piVar4 + 1;
        piVar5 = piVar5 + 1;
      } while (piVar4 != end);
    }
    local_4c = *(undefined4 *)((long)out + ((long)end - (long)begin) + -4);
    iVar1 = exscan<int,mxx::min<int>>(&local_4c,&local_48,param_4);
    if (end != begin && local_48.m_rank != 0) {
      lVar6 = (long)end - (long)begin >> 2;
      lVar2 = 0;
      do {
        iVar3 = out[lVar2];
        if (iVar1 <= out[lVar2]) {
          iVar3 = iVar1;
        }
        out[lVar2] = iVar3;
        lVar2 = lVar2 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar2);
    }
  }
  comm::~comm(&local_48);
  return;
}

Assistant:

void global_scan(InIterator begin, InIterator end, OutIterator out, Func func, const bool commutative, const mxx::comm& comm = mxx::comm()) {
    OutIterator o = out;
    size_t n = std::distance(begin, end);
    // create subcommunicator for those processes which contain elements
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        // local scan
        local_scan(begin, end, out, func);
        // mxx::scan
        typedef typename std::iterator_traits<OutIterator>::value_type T;
        T sum = *(out+(n-1));
        T presum = exscan(sum, func, nonzero_comm, commutative);
        if (nonzero_comm.rank() != 0) {
            // accumulate previous sum on all local elements
            for (size_t i = 0; i < n; ++i) {
                *o = func(presum, *o);
                ++o;
            }
        }
    }
}